

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

bool __thiscall ON_wString::Insert(ON_wString *this,int index,wchar_t ch,int insert_count)

{
  size_t array_capacity;
  uint uVar1;
  wchar_t *pwVar2;
  undefined1 auVar3 [16];
  ON_Internal_Empty_wString *pOVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  long lVar11;
  
  if (ch != L'\0' && -1 < (insert_count | index)) {
    pOVar4 = (ON_Internal_Empty_wString *)(this->m_s + -3);
    if (this->m_s == (wchar_t *)0x0) {
      pOVar4 = &empty_wstring;
    }
    uVar1 = (pOVar4->header).string_length;
    if ((uint)index <= uVar1) {
      uVar7 = (ulong)(uint)index;
      uVar5 = (ulong)(uint)insert_count;
      array_capacity = (long)(int)uVar1 + uVar5;
      ReserveArray(this,array_capacity);
      pwVar2 = this->m_s;
      memmove(pwVar2 + uVar7 + uVar5,pwVar2 + uVar7,((long)(int)uVar1 - uVar7) * 4 + 4);
      auVar3 = _DAT_0069b120;
      if (0 < insert_count) {
        lVar6 = uVar5 - 1;
        auVar8._8_4_ = (int)lVar6;
        auVar8._0_8_ = lVar6;
        auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
        lVar6 = 0;
        auVar8 = auVar8 ^ _DAT_0069b120;
        auVar10 = _DAT_0069b160;
        auVar12 = _DAT_0069b170;
        do {
          auVar13 = auVar12 ^ auVar3;
          iVar9 = auVar8._4_4_;
          if ((bool)(~(auVar13._4_4_ == iVar9 && auVar8._0_4_ < auVar13._0_4_ ||
                      iVar9 < auVar13._4_4_) & 1)) {
            *(wchar_t *)((long)pwVar2 + lVar6 + uVar7 * 4) = ch;
          }
          if ((auVar13._12_4_ != auVar8._12_4_ || auVar13._8_4_ <= auVar8._8_4_) &&
              auVar13._12_4_ <= auVar8._12_4_) {
            *(wchar_t *)((long)pwVar2 + lVar6 + uVar7 * 4 + 4) = ch;
          }
          auVar13 = auVar10 ^ auVar3;
          iVar14 = auVar13._4_4_;
          if (iVar14 <= iVar9 && (iVar14 != iVar9 || auVar13._0_4_ <= auVar8._0_4_)) {
            *(wchar_t *)((long)pwVar2 + lVar6 + uVar7 * 4 + 8) = ch;
            *(wchar_t *)((long)pwVar2 + lVar6 + uVar7 * 4 + 0xc) = ch;
          }
          lVar11 = auVar12._8_8_;
          auVar12._0_8_ = auVar12._0_8_ + 4;
          auVar12._8_8_ = lVar11 + 4;
          lVar11 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 4;
          auVar10._8_8_ = lVar11 + 4;
          lVar6 = lVar6 + 0x10;
        } while ((ulong)(insert_count + 3U >> 2) << 4 != lVar6);
      }
      pOVar4 = (ON_Internal_Empty_wString *)(this->m_s + -3);
      if (this->m_s == (wchar_t *)0x0) {
        pOVar4 = &empty_wstring;
      }
      (pOVar4->header).string_length = (int)array_capacity;
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_wString::Insert(int index, wchar_t ch, int insert_count)
{
  if ((index < 0) || (insert_count < 0) || (ch == 0))
    return false;

  const auto length = size_t(Header()->string_length);
  if (index > length)
    return false;

  const auto new_length = length + insert_count;
  ReserveArray(new_length);

  auto* p = m_s + index;
  const auto move_bytes = (length - index + 1) * sizeof(wchar_t);
  memmove(p + insert_count, p, move_bytes);

  for (int i = 0; i < insert_count; i++)
  {
    p[i] = ch;
  }

  Header()->string_length = int(new_length);

  return true;
}